

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O0

void readData<float>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,float **data)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  string *psVar9;
  ulong uVar10;
  float *pfVar11;
  int iStride;
  int jStride;
  int kStride;
  int lStride;
  string fieldName;
  int fieldLength;
  int lSize;
  int kSize;
  int jSize;
  int iSize;
  float **data_local;
  Savepoint *savepoint_local;
  DataFieldInfo *info_local;
  Serializer *serializer_local;
  
  iVar3 = ser::DataFieldInfo::iSize(info);
  iVar4 = ser::DataFieldInfo::jSize(info);
  iVar5 = ser::DataFieldInfo::kSize(info);
  iVar6 = ser::DataFieldInfo::lSize(info);
  fieldName.field_2._12_4_ = ser::DataFieldInfo::bytesPerElement(info);
  psVar9 = ser::DataFieldInfo::name_abi_cxx11_(info);
  std::__cxx11::string::string((string *)&kStride,(string *)psVar9);
  uVar2 = fieldName.field_2._12_4_;
  iVar7 = iVar6 * fieldName.field_2._12_4_;
  uVar8 = iVar5 * iVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(iVar3 * iVar4 * iVar5 * iVar6);
  uVar10 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pfVar11 = (float *)operator_new__(uVar10);
  *data = pfVar11;
  (*serializer->_vptr_Serializer[3])
            (serializer,&kStride,savepoint,*data,(ulong)(iVar4 * uVar8),(ulong)uVar8,iVar7,uVar2,0);
  std::__cxx11::string::~string((string *)&kStride);
  return;
}

Assistant:

void readData(const ser::Serializer& serializer, const ser::DataFieldInfo& info, const ser::Savepoint& savepoint, T*& data)
{
	int iSize = info.iSize();
	int jSize = info.jSize();
	int kSize = info.kSize();
	int lSize = info.lSize();
	int fieldLength = info.bytesPerElement();
	std::string fieldName = info.name();

	int lStride = fieldLength;
	int kStride = lSize * lStride;
	int jStride = kSize * kStride;
	int iStride = jSize * jStride;

	data = new T[iSize * jSize * kSize * lSize];
	serializer.ReadField(fieldName, savepoint, data, iStride, jStride, kStride, lStride);
}